

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# oneof.cc
# Opt level: O1

void __thiscall
google::protobuf::compiler::objectivec::OneofGenerator::GenerateClearFunctionDeclaration
          (OneofGenerator *this,Printer *printer)

{
  Cleanup<absl::lts_20240722::cleanup_internal::Tag,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_pybind[P]pybind11_protobuf_build_O1__deps_protobuf_src_src_google_protobuf_io_printer_h:1039:28)>
  vars;
  Cleanup<absl::lts_20240722::cleanup_internal::Tag,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_pybind[P]pybind11_protobuf_build_O1__deps_protobuf_src_src_google_protobuf_io_printer_h:1039:28)>
  local_18;
  
  io::Printer::
  WithVars<absl::lts_20240722::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20240722::container_internal::StringHash,absl::lts_20240722::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>const&,void,void>
            (&local_18,printer,&this->variables_);
  google::protobuf::io::Printer::Emit
            (printer,0,0,0xbe,
             "\n      /**\n       * Clears whatever value was set for the oneof \'$name$\'.\n       **/\n      void $owning_message_class$_Clear$capitalized_name$OneOfCase($owning_message_class$ *message);\n    "
            );
  if (local_18.storage_.is_callback_engaged_ == true) {
    std::
    vector<std::function<std::optional<google::protobuf::io::Printer::ValueImpl<false>_>_(std::basic_string_view<char,_std::char_traits<char>_>)>,_std::allocator<std::function<std::optional<google::protobuf::io::Printer::ValueImpl<false>_>_(std::basic_string_view<char,_std::char_traits<char>_>)>_>_>
    ::pop_back((vector<std::function<std::optional<google::protobuf::io::Printer::ValueImpl<false>_>_(std::basic_string_view<char,_std::char_traits<char>_>)>,_std::allocator<std::function<std::optional<google::protobuf::io::Printer::ValueImpl<false>_>_(std::basic_string_view<char,_std::char_traits<char>_>)>_>_>
                *)((long)local_18.storage_.callback_buffer_ + 0x98));
  }
  return;
}

Assistant:

void OneofGenerator::GenerateClearFunctionDeclaration(
    io::Printer* printer) const {
  auto vars = printer->WithVars(variables_);
  printer->Emit(R"objc(
      /**
       * Clears whatever value was set for the oneof '$name$'.
       **/
      void $owning_message_class$_Clear$capitalized_name$OneOfCase($owning_message_class$ *message);
    )objc");
}